

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O0

void __thiscall TTD::UtilSupport::TTAutoString::Clear(TTAutoString *this)

{
  TTAutoString *this_local;
  
  if (this->m_contents != (char16 *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,char16_t>
              (&Memory::HeapAllocator::Instance,this->m_allocSize,this->m_contents);
    this->m_allocSize = -1;
    this->m_contents = (char16 *)0x0;
  }
  if (this->m_optFormatBuff != (char16 *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,char16_t>
              (&Memory::HeapAllocator::Instance,0x40,this->m_optFormatBuff);
    this->m_optFormatBuff = (char16 *)0x0;
  }
  return;
}

Assistant:

void TTAutoString::Clear()
        {
            if(this->m_contents != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16, this->m_contents, (size_t)this->m_allocSize);
                this->m_allocSize = -1;
                this->m_contents = nullptr;
            }

            if(this->m_optFormatBuff != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16, this->m_optFormatBuff, 64);
                this->m_optFormatBuff = nullptr;
            }
        }